

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Targa.cpp
# Opt level: O2

void __thiscall TargaImage::put_pixel(TargaImage *this,rgb color)

{
  int iVar1;
  rgb *prVar2;
  
  prVar2 = this->buffer;
  iVar1 = this->pos;
  prVar2[iVar1].r = color.b;
  prVar2[iVar1].g = color.g;
  prVar2[iVar1].b = color.r;
  this->pos = iVar1 + 1;
  if (iVar1 + 1 < this->buf_size) {
    return;
  }
  flush(this);
  return;
}

Assistant:

void TargaImage::put_pixel( rgb color )
{
    buffer[pos].r =   color.b; // swap red & blue   colors
    buffer[pos].g =   color.g;
    buffer[pos].b =   color.r;

    if( ++pos >= buf_size ) flush();
}